

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O3

void __thiscall bal::GraphMLStreamWriter::write_footer(GraphMLStreamWriter *this,Cnf *value)

{
  ostream *poVar1;
  
  poVar1 = (this->super_StreamWriter<bal::Cnf>).stream_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</graph>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = (this->super_StreamWriter<bal::Cnf>).stream_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</graphml>",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void write_footer(const Cnf& value) {
            stream() << "</graph>" << std::endl;
            stream() << "</graphml>" << std::endl;
        }